

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.h
# Opt level: O0

void __thiscall Js::AsmJsFunctionInfo::AsmJsFunctionInfo(AsmJsFunctionInfo *this)

{
  AsmJsFunctionInfo *local_50;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  nullptr_t local_18;
  AsmJsFunctionInfo *local_10;
  AsmJsFunctionInfo *this_local;
  
  local_50 = this;
  local_10 = this;
  do {
    WAsmJs::TypedSlotInfo::TypedSlotInfo(local_50->mTypedSlotInfos);
    local_50 = (AsmJsFunctionInfo *)(local_50->mTypedSlotInfos + 1);
  } while (local_50 != (AsmJsFunctionInfo *)&this->mArgCount);
  this->mArgCount = 0;
  local_18 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::AsmJsVarType::Which>::WriteBarrierPtr(&this->mArgType,&local_18);
  this->mArgSizesLength = 0;
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierPtr(&this->mArgSizes,&local_20);
  this->mArgByteSize = 0;
  AsmJsRetType::AsmJsRetType(&this->mReturnType,Void);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Wasm::WasmSignature>::WriteBarrierPtr(&this->mSignature,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Wasm::WasmReaderInfo>::WriteBarrierPtr(&this->mWasmReaderInfo,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::WebAssemblyModule>::WriteBarrierPtr(&this->mWasmModule,&local_38);
  this->mUsesHeapBuffer = false;
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr
            (&this->asmJsModuleFunctionBody,&local_40);
  Memory::WriteBarrierPtr<Js::JavascriptError>::WriteBarrierPtr(&this->mLazyError);
  this->mTotalSizeBytes = 0;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->mbyteCodeTJMap);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierPtr(&this->mTJBeginAddress,&local_48);
  return;
}

Assistant:

AsmJsFunctionInfo() : mArgCount(0),
                              mArgSizesLength(0),
                              mReturnType(AsmJsRetType::Void),
                              mArgByteSize(0),
                              asmJsModuleFunctionBody(nullptr),
                              mTJBeginAddress(nullptr),
#ifdef ENABLE_WASM
                              mWasmReaderInfo(nullptr),
                              mSignature(nullptr),
                              mWasmModule(nullptr),
#endif
                              mUsesHeapBuffer(false),
                              mArgType(nullptr),
                              mArgSizes(nullptr) {}